

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,ByteData *byte_data)

{
  wally_psbt *psbt;
  CfdException *pCVar1;
  int ret;
  size_t is_elements;
  int local_74;
  size_t local_70;
  undefined1 local_68 [64];
  
  this->_vptr_Psbt = (_func_int **)&PTR__Psbt_006a6830;
  Transaction::Transaction(&this->base_tx_);
  psbt = ParsePsbtData(byte_data);
  local_70 = 0;
  local_74 = wally_psbt_is_elements(psbt,&local_70);
  if (local_74 != 0) {
    wally_psbt_free(psbt);
    local_68._0_8_ = "cfdcore_psbt.cpp";
    local_68._8_4_ = 0x70f;
    local_68._16_8_ = (long)"MergePsbt" + 5;
    logger::log<int&>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,
                      "wally_psbt_is_elements NG[{}]",&local_74);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"psbt elements check error.","");
    CfdException::CfdException(pCVar1,kCfdInternalError,(string *)local_68);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_70 == 0) {
    this->wally_psbt_pointer_ = psbt;
    RebuildTransaction((Transaction *)local_68,psbt);
    Transaction::operator=(&this->base_tx_,(Transaction *)local_68);
    Transaction::~Transaction((Transaction *)local_68);
    return;
  }
  wally_psbt_free(psbt);
  local_68._0_8_ = "cfdcore_psbt.cpp";
  local_68._8_4_ = 0x714;
  local_68._16_8_ = (long)"MergePsbt" + 5;
  logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"psbt elements format.");
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = local_68 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"psbt bitcoin tx format error.","");
  CfdException::CfdException(pCVar1,kCfdInternalError,(string *)local_68);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Psbt::Psbt(const ByteData &byte_data) {
  struct wally_psbt *psbt_pointer = ParsePsbtData(byte_data);
  size_t is_elements = 0;
  int ret = wally_psbt_is_elements(psbt_pointer, &is_elements);
  if (ret != WALLY_OK) {
    wally_psbt_free(psbt_pointer);
    warn(CFD_LOG_SOURCE, "wally_psbt_is_elements NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt elements check error.");
  }
  if (is_elements != 0) {
    wally_psbt_free(psbt_pointer);
    warn(CFD_LOG_SOURCE, "psbt elements format.");
    throw CfdException(kCfdInternalError, "psbt bitcoin tx format error.");
  }
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}